

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineInputAssemblyStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineInputAssemblyStateCreateInfo>
          (Impl *this,VkPipelineInputAssemblyStateCreateInfo *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineInputAssemblyStateCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineInputAssemblyStateCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineInputAssemblyStateCreateInfo>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkPipelineInputAssemblyStateCreateInfo_const*,VkPipelineInputAssemblyStateCreateInfo*>
                (src,src + count,(VkPipelineInputAssemblyStateCreateInfo *)this_local);
    }
  }
  return (VkPipelineInputAssemblyStateCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}